

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O3

void __thiscall Loop::InsertLandingPad(Loop *this,FlowGraph *fg)

{
  RealCount *pRVar1;
  uint uVar2;
  Instr *pIVar3;
  BasicBlock *pBVar4;
  BranchInstr *this_00;
  Type pFVar5;
  code *pcVar6;
  bool bVar7;
  IRKind IVar8;
  Loop *currentLoop;
  BasicBlock *this_01;
  BasicBlock *pBVar9;
  LabelInstr *newLabelInstr;
  undefined4 *puVar10;
  Type *ppBVar11;
  Type *ppFVar12;
  Loop *pLVar13;
  long lVar14;
  Type pSVar15;
  Func **ppFVar16;
  Instr *pIVar17;
  undefined1 local_60 [8];
  EditingIterator iter;
  BasicBlock *local_38;
  BasicBlock *landingPad;
  
  this_01 = GetHeadBlock(this);
  iter.last = (NodeBase *)fg;
  pBVar9 = BasicBlock::New(fg);
  this->landingPad = pBVar9;
  pIVar3 = this_01->firstInstr;
  local_38 = pBVar9;
  newLabelInstr = IR::LabelInstr::New(Label,pIVar3->m_func,false);
  IR::Instr::SetByteCodeOffset(&newLabelInstr->super_Instr,pIVar3);
  IR::Instr::InsertBefore(pIVar3,&newLabelInstr->super_Instr);
  if ((pBVar9 != (BasicBlock *)0x0) && (newLabelInstr->m_block != (BasicBlock *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x2c8,"(this->m_block == nullptr || block == nullptr)",
                       "Overwriting existing block pointer");
    if (!bVar7) goto LAB_00414e28;
    *puVar10 = 0;
  }
  newLabelInstr->m_block = pBVar9;
  pIVar3 = this_01->firstInstr;
  IVar8 = pIVar3->m_kind;
  pIVar17 = pIVar3;
  if ((IVar8 != InstrKindLabel) && (IVar8 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar7) goto LAB_00414e28;
    *puVar10 = 0;
    pIVar17 = this_01->firstInstr;
    IVar8 = pIVar17->m_kind;
  }
  newLabelInstr->m_region = (Region *)pIVar3[1].m_src2;
  if ((IVar8 != InstrKindLabel) && (IVar8 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar7) goto LAB_00414e28;
    *puVar10 = 0;
  }
  newLabelInstr->field_0x78 = newLabelInstr->field_0x78 & 0xfb | *(byte *)&pIVar17[1].m_func & 4;
  uVar2 = *(uint *)&iter.last[0xb].next;
  *(uint *)&iter.last[0xb].next = uVar2 + 1;
  pBVar9->number = uVar2;
  pBVar9->firstInstr = &newLabelInstr->super_Instr;
  pBVar4 = this_01->prev;
  pBVar9->prev = pBVar4;
  pBVar4->next = pBVar9;
  local_38->next = this_01;
  this_01->prev = local_38;
  pLVar13 = this->parent;
  local_38->loop = pLVar13;
  if (pLVar13 != (Loop *)0x0) {
    do {
      local_60 = (undefined1  [8])&pLVar13->blockList;
      iter.super_Iterator.current = (NodeBase *)0x0;
      iter.super_Iterator.list =
           (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
      do {
        bVar7 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                          ((EditingIterator *)local_60);
        if (!bVar7) goto LAB_00414bea;
        ppBVar11 = SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                             ((Iterator *)local_60);
      } while ((*ppBVar11 != this_01) || ((*(ushort *)&(*ppBVar11)->field_0x18 & 1) != 0));
      SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::InsertBefore
                ((EditingIterator *)local_60,
                 (ArenaAllocator *)
                 (((SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount> *)
                  ((long)local_60 + 0x10))->super_SListNodeBase<Memory::ArenaAllocator>).next,
                 &local_38);
LAB_00414bea:
      pLVar13 = pLVar13->parent;
    } while (pLVar13 != (Loop *)0x0);
  }
  local_60 = (undefined1  [8])&this_01->predList;
  iter.super_Iterator.current = (NodeBase *)0x0;
  iter.super_Iterator.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_60;
  bVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                    ((EditingIterator *)local_60);
  if (bVar7) {
    do {
      ppFVar12 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                           ((Iterator *)local_60);
      pBVar9 = (*ppFVar12)->predBlock;
      pLVar13 = pBVar9->loop;
      if (pLVar13 != this) {
        if (pLVar13 != (Loop *)0x0) {
          do {
            pLVar13 = pLVar13->parent;
            if (pLVar13 == this) break;
          } while (pLVar13 != (Loop *)0x0);
          if (pLVar13 != (Loop *)0x0) goto LAB_00414d0a;
        }
        pBVar4 = pBVar9->next;
        ppFVar16 = (Func **)&pBVar4->firstInstr;
        if (pBVar4 == (BasicBlock *)0x0) {
          ppFVar16 = &pBVar9->func;
        }
        lVar14 = 0x18;
        if (pBVar4 == (BasicBlock *)0x0) {
          lVar14 = 0xd0;
        }
        this_00 = *(BranchInstr **)((long)&(*ppFVar16)->m_alloc + lVar14);
        if ((this_00->super_Instr).m_kind == InstrKindBranch) {
          IVar8 = (((LabelInstr *)this_01->firstInstr)->super_Instr).m_kind;
          if ((IVar8 == InstrKindProfiledLabel) || (IVar8 == InstrKindLabel)) {
            IR::BranchInstr::ReplaceTarget(this_00,(LabelInstr *)this_01->firstInstr,newLabelInstr);
            pBVar9 = (*ppFVar12)->predBlock;
          }
        }
        BasicBlock::UnlinkPred(this_01,pBVar9,false);
        pBVar9 = local_38;
        pFVar5 = *ppFVar12;
        pSVar15 = (Type)new<Memory::ArenaAllocator>
                                  (0x10,(ArenaAllocator *)(iter.last)->next,0x364470);
        pSVar15[1].next = (Type)pFVar5;
        pSVar15->next =
             (pBVar9->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
             super_SListNodeBase<Memory::ArenaAllocator>.next;
        (pBVar9->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
        super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar15;
        pRVar1 = &(pBVar9->predList).super_SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>.
                  super_RealCount;
        pRVar1->count = pRVar1->count + 1;
        (*ppFVar12)->succBlock = local_38;
      }
LAB_00414d0a:
      bVar7 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::EditingIterator::Next
                        ((EditingIterator *)local_60);
    } while (bVar7);
  }
  FlowGraph::AddEdge((FlowGraph *)iter.last,local_38,this_01);
  pIVar3 = this_01->firstInstr;
  IVar8 = pIVar3->m_kind;
  if ((IVar8 != InstrKindLabel) && (IVar8 != InstrKindProfiledLabel)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
    if (!bVar7) goto LAB_00414e28;
    *puVar10 = 0;
  }
  if (pIVar3[1].m_src2 != (Opnd *)0x0) {
    pIVar3 = this_01->firstInstr;
    IVar8 = pIVar3->m_kind;
    if ((IVar8 != InstrKindLabel) && (IVar8 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar7) {
LAB_00414e28:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
    }
    if (*(char *)&(pIVar3[1].m_src2)->_vptr_Opnd != '\x01') {
      newLabelInstr->field_0x78 = newLabelInstr->field_0x78 | 4;
    }
  }
  return;
}

Assistant:

void
Loop::InsertLandingPad(FlowGraph *fg)
{
    BasicBlock *headBlock = this->GetHeadBlock();

    // Always create a landing pad.  This allows globopt to easily hoist instructions
    // and re-optimize the block if needed.
    BasicBlock *landingPad = BasicBlock::New(fg);
    this->landingPad = landingPad;
    IR::Instr * headInstr = headBlock->GetFirstInstr();
    IR::LabelInstr *landingPadLabel = IR::LabelInstr::New(Js::OpCode::Label, headInstr->m_func);
    landingPadLabel->SetByteCodeOffset(headInstr);
    headInstr->InsertBefore(landingPadLabel);

    landingPadLabel->SetBasicBlock(landingPad);
    landingPadLabel->SetRegion(headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion());
    landingPadLabel->m_hasNonBranchRef = headBlock->GetFirstInstr()->AsLabelInstr()->m_hasNonBranchRef;
    landingPad->SetBlockNum(fg->blockCount++);
    landingPad->SetFirstInstr(landingPadLabel);
    landingPad->SetLastInstr(landingPadLabel);

    landingPad->prev = headBlock->prev;
    landingPad->prev->next = landingPad;
    landingPad->next = headBlock;
    headBlock->prev = landingPad;

    Loop *parentLoop = this->parent;
    landingPad->loop = parentLoop;

    // We need to add this block to the block list of the parent loops
    while (parentLoop)
    {
        // Find the head block in the block list of the parent loop
        FOREACH_BLOCK_IN_LOOP_EDITING(block, parentLoop, iter)
        {
            if (block == headBlock)
            {
                // Add the landing pad to the block list
                iter.InsertBefore(landingPad);
                break;
            }
        } NEXT_BLOCK_IN_LOOP_EDITING;

        parentLoop = parentLoop->parent;
    }

    // Fix predecessor flow edges
    FOREACH_PREDECESSOR_EDGE_EDITING(edge, headBlock, iter)
    {
        // Make sure it isn't a back-edge
        if (edge->GetPred()->loop != this && !this->IsDescendentOrSelf(edge->GetPred()->loop))
        {
            if (edge->GetPred()->GetLastInstr()->IsBranchInstr() && headBlock->GetFirstInstr()->IsLabelInstr())
            {
                IR::BranchInstr *branch = edge->GetPred()->GetLastInstr()->AsBranchInstr();
                branch->ReplaceTarget(headBlock->GetFirstInstr()->AsLabelInstr(), landingPadLabel);
            }
            headBlock->UnlinkPred(edge->GetPred(), false);
            landingPad->AddPred(edge, fg);
            edge->SetSucc(landingPad);
        }
    } NEXT_PREDECESSOR_EDGE_EDITING;

    fg->AddEdge(landingPad, headBlock);

    if (headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion() && headBlock->GetFirstInstr()->AsLabelInstr()->GetRegion()->GetType() != RegionTypeRoot)
    {
        landingPadLabel->m_hasNonBranchRef = true;
    }
}